

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O2

ScenarioLowerBound * __thiscall
despot::DSPOMDP::CreateScenarioLowerBound(DSPOMDP *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  int iVar2;
  ScenarioLowerBound *this_00;
  RandomPolicy *this_01;
  undefined4 extraout_var;
  ostream *poVar3;
  string asStack_38 [32];
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if ((!bVar1) && (bVar1 = std::operator==(name,"DEFAULT"), !bVar1)) {
    bVar1 = std::operator==(name,"RANDOM");
    if (bVar1) {
      this_01 = (RandomPolicy *)operator_new(0x38);
      std::__cxx11::string::string(asStack_38,(string *)particle_bound_name);
      iVar2 = (*this->_vptr_DSPOMDP[0xe])(this,asStack_38);
      RandomPolicy::RandomPolicy(this_01,this,(ParticleLowerBound *)CONCAT44(extraout_var,iVar2));
      std::__cxx11::string::~string(asStack_38);
      return (ScenarioLowerBound *)this_01;
    }
    bVar1 = std::operator!=(name,"print");
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported lower bound: ");
      poVar3 = std::operator<<(poVar3,(string *)name);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"Supported types: TRIVIAL (default)");
    std::endl<char,std::char_traits<char>>(poVar3);
    exit(1);
  }
  this_00 = (ScenarioLowerBound *)operator_new(0x10);
  TrivialParticleLowerBound::TrivialParticleLowerBound((TrivialParticleLowerBound *)this_00,this);
  return this_00;
}

Assistant:

ScenarioLowerBound* DSPOMDP::CreateScenarioLowerBound(string name,
		string particle_bound_name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleLowerBound(this);
	} else if (name == "RANDOM") {
		return new RandomPolicy(this,
				CreateParticleLowerBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL (default)" << endl;
		exit(1);
		return NULL;
	}
}